

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O3

void __thiscall
cmOSXBundleGenerator::CreateCFBundle
          (cmOSXBundleGenerator *this,string *targetName,string *root,string *config)

{
  bool bVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string plist;
  string out;
  string name;
  string local_128;
  string local_108;
  string local_e8;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined1 *local_b8;
  undefined1 local_b0 [32];
  string local_90;
  undefined1 *local_70;
  undefined8 local_68;
  size_type local_60;
  pointer local_58;
  string *local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  bVar1 = cmGeneratorTarget::HaveWellDefinedOutputFiles(this->GT);
  if (bVar1) {
    cmGeneratorTarget::GetCFBundleDirectory(&local_128,this->GT,config,FullLevel);
    local_90._M_string_length = (size_type)(root->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)root->_M_string_length;
    local_90.field_2._M_allocated_capacity = 0;
    local_c8 = 0;
    local_c0 = 1;
    local_b0[0] = 0x2f;
    local_90.field_2._8_8_ = 1;
    local_68 = 0;
    local_60 = local_128._M_string_length;
    local_58 = local_128._M_dataplus._M_p;
    views._M_len = 3;
    views._M_array = (iterator)&local_90;
    local_b8 = local_b0;
    local_70 = local_b0;
    local_50 = &local_128;
    cmCatViews(&local_e8,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::MakeDirectory(&local_e8,(mode_t *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&local_e8);
    cmGeneratorTarget::GetCFBundleDirectory(&local_108,this->GT,config,ContentLevel);
    local_90._M_string_length = (size_type)(root->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)root->_M_string_length;
    local_90.field_2._M_allocated_capacity = 0;
    local_c8 = 0;
    local_c0 = 1;
    local_b0[0] = 0x2f;
    local_90.field_2._8_8_ = 1;
    local_68 = 0;
    local_60 = local_108._M_string_length;
    local_58 = local_108._M_dataplus._M_p;
    local_48 = 0xb;
    local_40 = "/Info.plist";
    local_38 = 0;
    views_00._M_len = 4;
    views_00._M_array = (iterator)&local_90;
    local_b8 = local_b0;
    local_70 = local_b0;
    local_50 = &local_108;
    cmCatViews(&local_128,views_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::GetFilenameName(&local_90,targetName);
    cmLocalGenerator::GenerateAppleInfoPList(this->LocalGenerator,this->GT,&local_90,&local_128);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateCFBundle(const std::string& targetName,
                                          const std::string& root,
                                          const std::string& config)
{
  if (this->MustSkip()) {
    return;
  }

  // Compute bundle directory names.
  std::string out = cmStrCat(
    root, '/',
    this->GT->GetCFBundleDirectory(config, cmGeneratorTarget::FullLevel));
  cmSystemTools::MakeDirectory(out);
  this->Makefile->AddCMakeOutputFile(out);

  // Configure the Info.plist file.  Note that it needs the executable name
  // to be set.
  std::string plist = cmStrCat(
    root, '/',
    this->GT->GetCFBundleDirectory(config, cmGeneratorTarget::ContentLevel),
    "/Info.plist");
  std::string name = cmSystemTools::GetFilenameName(targetName);
  this->LocalGenerator->GenerateAppleInfoPList(this->GT, name, plist);
  this->Makefile->AddCMakeOutputFile(plist);
}